

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O2

bool __thiscall IRBuilder::IsLoopBodyReturnIPInstr(IRBuilder *this,Instr *instr)

{
  Opnd *this_00;
  bool bVar1;
  RegOpnd *pRVar2;
  
  this_00 = instr->m_dst;
  if ((this_00 != (Opnd *)0x0) && (bVar1 = IR::Opnd::IsRegOpnd(this_00), bVar1)) {
    pRVar2 = IR::Opnd::AsRegOpnd(this_00);
    return pRVar2->m_sym == this->m_loopBodyRetIPSym;
  }
  return false;
}

Assistant:

bool
IRBuilder::IsLoopBodyReturnIPInstr(IR::Instr * instr) const
{
     IR::Opnd * dst = instr->GetDst();
     return (dst && dst->IsRegOpnd() && dst->AsRegOpnd()->m_sym == m_loopBodyRetIPSym);
}